

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

void __thiscall
backward::TraceResolverLinuxBase::~TraceResolverLinuxBase(TraceResolverLinuxBase *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__TraceResolverLinuxBase_00122cc0;
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  std::__cxx11::string::~string((string *)(in_RDI + 4));
  TraceResolverImplBase::~TraceResolverImplBase((TraceResolverImplBase *)0x113812);
  return;
}

Assistant:

TraceResolverLinuxBase()
      : argv0_(get_argv0()), exec_path_(read_symlink("/proc/self/exe")) {}